

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

void __thiscall
rr::TriangleRasterizer::TriangleRasterizer
          (TriangleRasterizer *this,IVec4 *viewport,int numSamples,RasterizationState *state)

{
  RasterizationState *state_local;
  int numSamples_local;
  IVec4 *viewport_local;
  TriangleRasterizer *this_local;
  
  tcu::Vector<int,_4>::Vector(&this->m_viewport,viewport);
  this->m_numSamples = numSamples;
  this->m_winding = state->winding;
  this->m_horizontalFill = state->horizontalFill;
  this->m_verticalFill = state->verticalFill;
  tcu::Vector<float,_4>::Vector(&this->m_v0);
  tcu::Vector<float,_4>::Vector(&this->m_v1);
  tcu::Vector<float,_4>::Vector(&this->m_v2);
  EdgeFunction::EdgeFunction(&this->m_edge01);
  EdgeFunction::EdgeFunction(&this->m_edge12);
  EdgeFunction::EdgeFunction(&this->m_edge20);
  this->m_face = FACETYPE_LAST;
  tcu::Vector<int,_2>::Vector(&this->m_bboxMin);
  tcu::Vector<int,_2>::Vector(&this->m_bboxMax);
  tcu::Vector<int,_2>::Vector(&this->m_curPos);
  this->m_viewportOrientation = state->viewportOrientation;
  return;
}

Assistant:

TriangleRasterizer::TriangleRasterizer (const tcu::IVec4& viewport, const int numSamples, const RasterizationState& state)
	: m_viewport				(viewport)
	, m_numSamples				(numSamples)
	, m_winding					(state.winding)
	, m_horizontalFill			(state.horizontalFill)
	, m_verticalFill			(state.verticalFill)
	, m_face					(FACETYPE_LAST)
	, m_viewportOrientation		(state.viewportOrientation)
{
}